

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLogLog>::operator()
          (RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  uint uVar14;
  GetterHeatmap<short> *pGVar15;
  TransformerLogLog *pTVar16;
  ImPlotPlot *pIVar17;
  ImDrawVert *pIVar18;
  ImDrawIdx *pIVar19;
  double dVar20;
  double dVar21;
  ImVec2 IVar22;
  ImPlotContext *pIVar23;
  ImPlotContext *pIVar24;
  bool bVar25;
  bool bVar26;
  ImDrawIdx IVar27;
  ImU32 IVar28;
  float fVar29;
  float fVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  ImVec2 IVar38;
  
  pGVar15 = this->Getter;
  dVar2 = (pGVar15->HalfSize).x;
  dVar20 = (double)(prim % pGVar15->Cols) * pGVar15->Width + pGVar15->XRef + dVar2;
  dVar34 = (pGVar15->HalfSize).y;
  dVar21 = ((double)(prim / pGVar15->Cols) * pGVar15->Height + dVar34) * pGVar15->YDir +
           pGVar15->YRef;
  fVar29 = (float)(((double)(int)pGVar15->Values[prim] - pGVar15->ScaleMin) /
                  (pGVar15->ScaleMax - pGVar15->ScaleMin));
  fVar35 = 1.0;
  if (fVar29 <= 1.0) {
    fVar35 = fVar29;
  }
  IVar28 = ImPlotColormapData::LerpTable
                     (&GImPlot->ColormapData,(GImPlot->Style).Colormap,
                      (float)(~-(uint)(fVar29 < 0.0) & (uint)fVar35));
  pIVar23 = GImPlot;
  pTVar16 = this->Transformer;
  dVar31 = log10((dVar20 - dVar2) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar23->LogDenX;
  pIVar17 = pIVar23->CurrentPlot;
  dVar4 = (pIVar17->XAxis).Range.Min;
  dVar5 = (pIVar17->XAxis).Range.Max;
  dVar32 = log10((dVar21 - dVar34) / pIVar17->YAxis[pTVar16->YAxis].Range.Min);
  pIVar24 = GImPlot;
  iVar13 = pTVar16->YAxis;
  dVar6 = pIVar23->LogDenY[iVar13];
  pIVar17 = pIVar23->CurrentPlot;
  dVar7 = pIVar17->YAxis[iVar13].Range.Min;
  dVar8 = pIVar17->YAxis[iVar13].Range.Max;
  dVar9 = pIVar23->My[iVar13];
  fVar35 = pIVar23->PixelRange[iVar13].Min.x;
  dVar10 = (pIVar17->XAxis).Range.Min;
  dVar11 = pIVar23->Mx;
  fVar29 = pIVar23->PixelRange[iVar13].Min.y;
  pTVar16 = this->Transformer;
  dVar33 = log10((dVar20 + dVar2) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar24->LogDenX;
  pIVar17 = pIVar24->CurrentPlot;
  dVar20 = (pIVar17->XAxis).Range.Min;
  dVar12 = (pIVar17->XAxis).Range.Max;
  dVar34 = log10((dVar21 + dVar34) / pIVar17->YAxis[pTVar16->YAxis].Range.Min);
  if (IVar28 < 0x1000000) {
    bVar26 = false;
  }
  else {
    fVar36 = (float)((((double)(float)(dVar32 / dVar6) * (dVar8 - dVar7) + dVar7) - dVar7) * dVar9 +
                    (double)fVar29);
    iVar13 = pTVar16->YAxis;
    pIVar17 = pIVar24->CurrentPlot;
    dVar21 = pIVar17->YAxis[iVar13].Range.Min;
    fVar30 = (float)((((double)(float)(dVar34 / pIVar24->LogDenY[iVar13]) *
                       (pIVar17->YAxis[iVar13].Range.Max - dVar21) + dVar21) - dVar21) *
                     pIVar24->My[iVar13] + (double)pIVar24->PixelRange[iVar13].Min.y);
    fVar29 = fVar36;
    if (fVar30 <= fVar36) {
      fVar29 = fVar30;
    }
    bVar25 = false;
    bVar26 = false;
    if ((fVar29 < (cull_rect->Max).y) &&
       (fVar29 = (float)(~-(uint)(fVar30 <= fVar36) & (uint)fVar30 |
                        -(uint)(fVar30 <= fVar36) & (uint)fVar36), pfVar1 = &(cull_rect->Min).y,
       bVar26 = bVar25, *pfVar1 <= fVar29 && fVar29 != *pfVar1)) {
      fVar29 = (float)((((double)(float)(dVar31 / dVar3) * (dVar5 - dVar4) + dVar4) - dVar10) *
                       dVar11 + (double)fVar35);
      fVar37 = (float)((((double)(float)(dVar33 / dVar2) * (dVar12 - dVar20) + dVar20) -
                       (pIVar17->XAxis).Range.Min) * pIVar24->Mx +
                      (double)pIVar24->PixelRange[iVar13].Min.x);
      fVar35 = fVar29;
      if (fVar37 <= fVar29) {
        fVar35 = fVar37;
      }
      if ((fVar35 < (cull_rect->Max).x) &&
         (fVar35 = (float)(~-(uint)(fVar37 <= fVar29) & (uint)fVar37 |
                          -(uint)(fVar37 <= fVar29) & (uint)fVar29),
         (cull_rect->Min).x <= fVar35 && fVar35 != (cull_rect->Min).x)) {
        IVar38.y = fVar36;
        IVar38.x = fVar29;
        DrawList->_VtxWritePtr->pos = IVar38;
        DrawList->_VtxWritePtr->uv = *uv;
        pIVar18 = DrawList->_VtxWritePtr;
        pIVar18->col = IVar28;
        pIVar18[1].pos.x = fVar29;
        pIVar18[1].pos.y = fVar30;
        pIVar18[1].uv = *uv;
        pIVar18 = DrawList->_VtxWritePtr;
        pIVar18[1].col = IVar28;
        IVar22.y = fVar30;
        IVar22.x = fVar37;
        pIVar18[2].pos = IVar22;
        DrawList->_VtxWritePtr[2].uv = *uv;
        pIVar18 = DrawList->_VtxWritePtr;
        pIVar18[2].col = IVar28;
        pIVar18[3].pos.x = fVar37;
        pIVar18[3].pos.y = fVar36;
        pIVar18[3].uv = *uv;
        pIVar18 = DrawList->_VtxWritePtr;
        pIVar18[3].col = IVar28;
        DrawList->_VtxWritePtr = pIVar18 + 4;
        uVar14 = DrawList->_VtxCurrentIdx;
        pIVar19 = DrawList->_IdxWritePtr;
        IVar27 = (ImDrawIdx)uVar14;
        *pIVar19 = IVar27;
        pIVar19[1] = IVar27 + 1;
        pIVar19[2] = IVar27 + 3;
        pIVar19[3] = IVar27 + 1;
        pIVar19[4] = IVar27 + 2;
        pIVar19[5] = IVar27 + 3;
        DrawList->_IdxWritePtr = pIVar19 + 6;
        DrawList->_VtxCurrentIdx = uVar14 + 4;
        bVar26 = true;
      }
    }
  }
  return bVar26;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        RectInfo rect = Getter(prim);
        ImVec2 P1 = Transformer(rect.Min);
        ImVec2 P2 = Transformer(rect.Max);

        if ((rect.Color & IM_COL32_A_MASK) == 0 || !cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;

        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = rect.Color;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = rect.Color;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = rect.Color;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = rect.Color;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }